

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar2;
  int iVar3;
  code *pcStack_d0;
  TidyParserMemory memory_2;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Bool iswhitenode;
  Bool checkstack;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *body_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  memory.register_2 = 0;
  lexer._4_4_ = IgnoreWhitespace;
  memory._44_4_ = 1;
  if (body == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    memory._44_4_ = memory.reentry_state;
    memory.register_2 = memory.mode;
    lexer._4_4_ = memory.reentry_mode;
  }
  else {
    prvTidyBumpObject(doc,body->parent);
    pNStack_20 = body;
  }
LAB_00147780:
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            _iswhitenode = prvTidyGetToken(doc,lexer._4_4_);
            if (_iswhitenode == (Node *)0x0) {
              return (Node *)0x0;
            }
            if ((_iswhitenode->tag != pNStack_20->tag) || (_iswhitenode->type != StartTag)) break;
            prvTidyReport(doc,pNStack_20,_iswhitenode,0x235);
            prvTidyFreeNode(doc,_iswhitenode);
          }
          if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
             (_iswhitenode->tag->id != TidyTag_HTML)) break;
          BVar2 = prvTidynodeIsElement(_iswhitenode);
          if ((BVar2 == no) && (pLVar1->seenEndHtml == no)) {
            pLVar1->seenEndHtml = yes;
          }
          else {
            prvTidyReport(doc,pNStack_20,_iswhitenode,0x235);
          }
          prvTidyFreeNode(doc,_iswhitenode);
        }
        if ((pLVar1->seenEndBody != no) &&
           (((_iswhitenode->type == StartTag || (_iswhitenode->type == EndTag)) ||
            (_iswhitenode->type == StartEndTag)))) {
          prvTidyReport(doc,pNStack_20,_iswhitenode,0x233);
        }
        if ((_iswhitenode->tag != pNStack_20->tag) || (_iswhitenode->type != EndTag)) break;
        pNStack_20->closed = yes;
        TrimSpaces(doc,pNStack_20);
        prvTidyFreeNode(doc,_iswhitenode);
        pLVar1->seenEndBody = yes;
        lexer._4_4_ = IgnoreWhitespace;
        if ((pNStack_20->parent != (Node *)0x0) &&
           ((pNStack_20->parent->tag != (Dict *)0x0 &&
            (pNStack_20->parent->tag->id == TidyTag_NOFRAMES)))) {
          return (Node *)0x0;
        }
      }
      if (((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
         (_iswhitenode->tag->id == TidyTag_NOFRAMES)) {
        if (_iswhitenode->type == StartTag) {
          memset(&memory_2.register_2,0,0x30);
          prvTidyInsertNodeAtEnd(pNStack_20,_iswhitenode);
          memory_2._40_8_ = prvTidyParseBody;
          memory_1.identity = (Parser *)pNStack_20;
          memory_1.reentry_state = memory._44_4_;
          memory_1.mode = memory.register_2;
          memory_1.reentry_mode = lexer._4_4_;
          data.register_1 = memory._44_4_;
          data.mode = lexer._4_4_;
          data._44_4_ = memory_1.register_1;
          data.register_2 = memory.register_2;
          data.original_node = pNStack_20;
          data.identity = prvTidyParseBody;
          data.reentry_node = _iswhitenode;
          data._24_8_ = memory_1.reentry_node;
          memory_1.original_node = _iswhitenode;
          prvTidypushMemory(doc,data);
          return _iswhitenode;
        }
        if (((_iswhitenode->type == EndTag) && (pNStack_20->parent != (Node *)0x0)) &&
           ((pNStack_20->parent->tag != (Dict *)0x0 &&
            (pNStack_20->parent->tag->id == TidyTag_NOFRAMES)))) {
          TrimSpaces(doc,pNStack_20);
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
      }
      if ((((((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
            (_iswhitenode->tag->id == TidyTag_FRAME)) ||
           (((_iswhitenode != (Node *)0x0 && (_iswhitenode->tag != (Dict *)0x0)) &&
            (_iswhitenode->tag->id == TidyTag_FRAMESET)))) &&
          ((pNStack_20->parent != (Node *)0x0 && (pNStack_20->parent->tag != (Dict *)0x0)))) &&
         (pNStack_20->parent->tag->id == TidyTag_NOFRAMES)) {
        TrimSpaces(doc,pNStack_20);
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
      memory.register_2 = 0;
      BVar2 = prvTidynodeIsText(_iswhitenode);
      if (((BVar2 != no) && (_iswhitenode->end <= _iswhitenode->start + 1)) &&
         (pLVar1->lexbuf[_iswhitenode->start] == ' ')) {
        memory.register_2 = 1;
      }
      BVar2 = InsertMisc(pNStack_20,_iswhitenode);
    } while (BVar2 != no);
    BVar2 = prvTidynodeIsText(_iswhitenode);
    if (BVar2 == no) {
      if (_iswhitenode->type == DocTypeTag) {
        InsertDocType(doc,pNStack_20,_iswhitenode);
        goto LAB_00147780;
      }
      if ((_iswhitenode->tag != (Dict *)0x0) &&
         (((_iswhitenode == (Node *)0x0 || (_iswhitenode->tag == (Dict *)0x0)) ||
          (_iswhitenode->tag->id != TidyTag_PARAM)))) {
        pLVar1->excludeBlocks = no;
        if ((((((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
              (_iswhitenode->tag->id == TidyTag_INPUT)) ||
             ((BVar2 = prvTidynodeHasCM(_iswhitenode,8), BVar2 == no &&
              (BVar2 = prvTidynodeHasCM(_iswhitenode,0x10), BVar2 == no)))) &&
            (BVar2 = prvTidyIsHTML5Mode(doc), BVar2 == no)) ||
           (((_iswhitenode != (Node *)0x0 && (_iswhitenode->tag != (Dict *)0x0)) &&
            (_iswhitenode->tag->id == TidyTag_LI)))) {
          if ((_iswhitenode->tag->model & 4) == 0) {
            prvTidyReport(doc,pNStack_20,_iswhitenode,0x27e);
          }
          if ((_iswhitenode->tag->model & 2) != 0) {
            if (((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
               ((_iswhitenode->tag->id == TidyTag_BODY &&
                ((pNStack_20->implicit != no && (pNStack_20->attributes == (AttVal *)0x0)))))) {
              pNStack_20->attributes = _iswhitenode->attributes;
              _iswhitenode->attributes = (AttVal *)0x0;
            }
            prvTidyFreeNode(doc,_iswhitenode);
            goto LAB_00147780;
          }
          if ((_iswhitenode->tag->model & 4) != 0) {
            MoveToHead(doc,pNStack_20,_iswhitenode);
            goto LAB_00147780;
          }
          if ((_iswhitenode->tag->model & 0x20) == 0) {
            if ((_iswhitenode->tag->model & 0x40) == 0) {
              if ((_iswhitenode->tag->model & 0x380) == 0) {
                if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
                   (_iswhitenode->tag->id != TidyTag_INPUT)) {
                  BVar2 = prvTidynodeHasCM(_iswhitenode,0x600);
                  if (BVar2 == no) {
                    prvTidyUngetToken(doc);
                    return (Node *)0x0;
                  }
                  prvTidyFreeNode(doc,_iswhitenode);
                  goto LAB_00147780;
                }
                prvTidyUngetToken(doc);
                _iswhitenode = prvTidyInferredTag(doc,TidyTag_FORM);
                pLVar1->excludeBlocks = yes;
              }
              else {
                if (_iswhitenode->type != EndTag) {
                  prvTidyUngetToken(doc);
                  _iswhitenode = prvTidyInferredTag(doc,TidyTag_TABLE);
                }
                pLVar1->excludeBlocks = yes;
              }
            }
            else {
              prvTidyUngetToken(doc);
              _iswhitenode = prvTidyInferredTag(doc,TidyTag_DL);
              pLVar1->excludeBlocks = yes;
            }
          }
          else {
            prvTidyUngetToken(doc);
            _iswhitenode = prvTidyInferredTag(doc,TidyTag_UL);
            AddClassNoIndent(doc,_iswhitenode);
            pLVar1->excludeBlocks = yes;
          }
        }
        if (_iswhitenode->type == EndTag) {
          if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
             (_iswhitenode->tag->id != TidyTag_BR)) {
            if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
               (_iswhitenode->tag->id != TidyTag_P)) {
              BVar2 = prvTidynodeHasCM(_iswhitenode,0x10);
              if (BVar2 != no) {
                prvTidyPopInline(doc,_iswhitenode);
              }
            }
            else {
              _iswhitenode->type = StartEndTag;
              _iswhitenode->implicit = yes;
            }
          }
          else {
            _iswhitenode->type = StartTag;
          }
        }
        BVar2 = prvTidynodeIsElement(_iswhitenode);
        if (BVar2 != no) {
          if ((((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
              (_iswhitenode->tag->id == TidyTag_MAIN)) &&
             (BVar2 = findNodeById(doc,TidyTag_MAIN), BVar2 != no)) {
            doc->badForm = doc->badForm | 2;
            prvTidyReport(doc,pNStack_20,_iswhitenode,0x235);
            prvTidyFreeNode(doc,_iswhitenode);
            goto LAB_00147780;
          }
          BVar2 = prvTidynodeHasCM(_iswhitenode,0x10);
          if (BVar2 == no) {
            memory._44_4_ = 1;
            lexer._4_4_ = IgnoreWhitespace;
          }
          else {
            if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
               (_iswhitenode->tag->id != TidyTag_IMG)) {
              prvTidyConstrainVersion(doc,0xfffffeda);
            }
            else {
              prvTidyConstrainVersion(doc,0xfffffedb);
            }
            if ((memory._44_4_ != 0) && (_iswhitenode->implicit == no)) {
              memory._44_4_ = 0;
              iVar3 = prvTidyInlineDup(doc,_iswhitenode);
              if (0 < iVar3) goto LAB_00147780;
            }
            lexer._4_4_ = MixedContent;
          }
          if (_iswhitenode->implicit != no) {
            prvTidyReport(doc,pNStack_20,_iswhitenode,0x247);
          }
          prvTidyInsertNodeAtEnd(pNStack_20,_iswhitenode);
          memset(&pcStack_d0,0,0x30);
          pcStack_d0 = prvTidyParseBody;
          memory_2.identity = (Parser *)pNStack_20;
          memory_2.original_node = _iswhitenode;
          memory_2.reentry_state = memory._44_4_;
          memory_2.mode = memory.register_2;
          memory_2.reentry_mode = lexer._4_4_;
          data_00.register_1 = memory._44_4_;
          data_00.mode = lexer._4_4_;
          data_00._44_4_ = memory_2.register_1;
          data_00.register_2 = memory.register_2;
          data_00.original_node = pNStack_20;
          data_00.identity = prvTidyParseBody;
          data_00.reentry_node = _iswhitenode;
          data_00._24_8_ = memory_2.reentry_node;
          prvTidypushMemory(doc,data_00);
          return _iswhitenode;
        }
        prvTidyReport(doc,pNStack_20,_iswhitenode,0x235);
        prvTidyFreeNode(doc,_iswhitenode);
        goto LAB_00147780;
      }
      prvTidyReport(doc,pNStack_20,_iswhitenode,0x235);
      prvTidyFreeNode(doc,_iswhitenode);
      goto LAB_00147780;
    }
    if ((memory.register_2 == 0) || (lexer._4_4_ != IgnoreWhitespace)) {
      prvTidyConstrainVersion(doc,0xfffffeda);
      if (memory._44_4_ != 0) {
        memory._44_4_ = 0;
        iVar3 = prvTidyInlineDup(doc,_iswhitenode);
        if (0 < iVar3) goto LAB_00147780;
      }
      prvTidyInsertNodeAtEnd(pNStack_20,_iswhitenode);
      lexer._4_4_ = MixedContent;
      goto LAB_00147780;
    }
    prvTidyFreeNode(doc,_iswhitenode);
  } while( true );
}

Assistant:

Node* TY_(ParseBody)( TidyDocImpl* doc, Node *body, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = no;
    Bool iswhitenode = no;
    DEBUG_LOG_COUNTERS;

    mode = IgnoreWhitespace;
    checkstack = yes;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( body == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        body = memory.original_node;
        checkstack = memory.register_1;
        iswhitenode = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(body);
        TY_(BumpObject)( doc, body->parent );
    }
    
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml)
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody &&
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TidyParserMemory memory = {0};

                TY_(InsertNodeAtEnd)(body, node);
                
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }

        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;

        if ((( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc)) || nodeIsLI(node) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node))
            {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( findNodeById(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
                
                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            if (node->implicit)
            {
                TY_(Report)(doc, body, node, INSERTING_TAG);
            }

            TY_(InsertNodeAtEnd)(body, node);
            
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
            }
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}